

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_resources(CompilerMSL *this)

{
  bool bVar1;
  ExecutionModel EVar2;
  SPIREntryPoint *pSVar3;
  char *topology;
  char *per_primitive;
  
  declare_constant_arrays(this);
  emit_interface_block(this,(this->stage_out_var_id).id);
  emit_interface_block(this,(this->patch_stage_out_var_id).id);
  emit_interface_block(this,(this->stage_in_var_id).id);
  emit_interface_block(this,(this->patch_stage_in_var_id).id);
  EVar2 = Compiler::get_execution_model((Compiler *)this);
  if (EVar2 == ExecutionModelMeshEXT) {
    pSVar3 = Compiler::get_entry_point((Compiler *)this);
    topology = "";
    bVar1 = Bitset::get(&pSVar3->flags,0x14b2);
    if (bVar1) {
      topology = "topology::triangle";
    }
    else {
      bVar1 = Bitset::get(&pSVar3->flags,0x1495);
      if (bVar1) {
        topology = "topology::line";
      }
      else if (((pSVar3->flags).lower & 0x8000000) != 0) {
        topology = "topology::point";
      }
    }
    per_primitive = "spvPerPrimitive";
    if ((this->mesh_out_per_primitive).id == 0) {
      per_primitive = "void";
    }
    CompilerGLSL::
    statement<char_const(&)[24],char_const(&)[15],char_const*&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],char_const*&,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [24])"using spvMesh_t = mesh<",
               (char (*) [15])"spvPerVertex, ",&per_primitive,(char (*) [3])0x294843,
               &pSVar3->output_vertices,(char (*) [3])0x294843,&pSVar3->output_primitives,
               (char (*) [3])0x294843,&topology,(char (*) [3])">;");
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x272bdf);
  }
  return;
}

Assistant:

void CompilerMSL::emit_resources()
{
	declare_constant_arrays();

	// Emit the special [[stage_in]] and [[stage_out]] interface blocks which we created.
	emit_interface_block(stage_out_var_id);
	emit_interface_block(patch_stage_out_var_id);
	emit_interface_block(stage_in_var_id);
	emit_interface_block(patch_stage_in_var_id);

	if (get_execution_model() == ExecutionModelMeshEXT)
	{
		auto &execution = get_entry_point();
		const char *topology = "";
		if (execution.flags.get(ExecutionModeOutputTrianglesEXT))
			topology = "topology::triangle";
		else if (execution.flags.get(ExecutionModeOutputLinesEXT))
			topology = "topology::line";
		else if (execution.flags.get(ExecutionModeOutputPoints))
			topology = "topology::point";

		const char *per_primitive = mesh_out_per_primitive ? "spvPerPrimitive" : "void";
		statement("using spvMesh_t = mesh<", "spvPerVertex, ", per_primitive, ", ", execution.output_vertices, ", ",
		          execution.output_primitives, ", ", topology, ">;");
		statement("");
	}
}